

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DerTypes.h
# Opt level: O2

ostream * operator<<(ostream *os,BitString *o)

{
  pointer puVar1;
  long lVar2;
  ostream *poVar3;
  long lVar4;
  ulong uVar5;
  ostringstream local_1d0 [8];
  ostringstream osTmp;
  string local_58 [32];
  ostream *local_38;
  
  puVar1 = (o->value).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_start;
  local_38 = os;
  std::__cxx11::ostringstream::ostringstream(local_1d0);
  lVar4 = 0;
  uVar5 = 0;
  while( true ) {
    if ((ulong)((long)(o->value).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                      _M_impl.super__Vector_impl_data._M_finish -
               (long)(o->value).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                     _M_impl.super__Vector_impl_data._M_start) <= uVar5) break;
    if ((uVar5 != 0) && ((uVar5 / 0x50) * 0x50 + lVar4 == 0)) {
      std::endl<char,std::char_traits<char>>((ostream *)local_1d0);
    }
    poVar3 = std::operator<<(local_1d0,0x30);
    lVar2 = *(long *)poVar3;
    *(undefined8 *)(poVar3 + *(long *)(lVar2 + -0x18) + 0x10) = 2;
    lVar2 = *(long *)(lVar2 + -0x18);
    *(uint *)(poVar3 + lVar2 + 0x18) = *(uint *)(poVar3 + lVar2 + 0x18) & 0xffffffb5 | 8;
    std::ostream::operator<<((ostream *)poVar3,(ushort)puVar1[uVar5]);
    uVar5 = uVar5 + 1;
    lVar4 = lVar4 + -1;
  }
  std::__cxx11::stringbuf::str();
  poVar3 = local_38;
  std::operator<<(local_38,local_58);
  std::__cxx11::string::~string(local_58);
  std::__cxx11::ostringstream::~ostringstream(local_1d0);
  return poVar3;
}

Assistant:

std::ostream& operator<<(std::ostream& os, const BitString& o)
	{
		const unsigned long linelength = 80;
		const unsigned char* pData = &o.value[0];
		std::ostringstream osTmp;

		for (size_t pos = 0; pos < o.value.size(); ++pos)
		{
            if (pos > 0 && (pos % linelength) == 0)
                osTmp << std::endl;

            // This is done byte by byte
			osTmp << std::setfill('0') << std::setw(2) << std::hex << (unsigned short)pData[pos];
		}

        os << osTmp.str();
		return os;
	}